

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (string *__return_storage_ptr__,TestResult *result,string *indent)

{
  string *psVar1;
  TestProperty *pTVar2;
  Message *pMVar3;
  int i;
  int i_00;
  allocator<char> local_91;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  string *local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_88 = __return_storage_ptr__;
  local_80 = indent;
  Message::Message((Message *)&local_90);
  for (i_00 = 0; psVar1 = local_88,
      i_00 < (int)((ulong)((long)(result->test_properties_).
                                 super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(result->test_properties_).
                                super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 6); i_00 = i_00 + 1) {
    pTVar2 = TestResult::GetTestProperty(result,i_00);
    std::operator<<((ostream *)(local_90._M_head_impl + 0x10),",\n");
    std::operator<<((ostream *)(local_90._M_head_impl + 0x10),(string *)local_80);
    std::operator<<((ostream *)(local_90._M_head_impl + 0x10),"\"");
    local_78 = (pTVar2->key_)._M_dataplus._M_p;
    pMVar3 = Message::operator<<((Message *)&local_90,&local_78);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [4])"\": ");
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x132711);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(pTVar2->value_)._M_dataplus._M_p,&local_91);
    EscapeJson(&local_50,&local_70);
    pMVar3 = Message::operator<<(pMVar3,&local_50);
    Message::operator<<(pMVar3,(char (*) [2])0x132711);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  StringStreamToString(local_88,local_90._M_head_impl);
  if (local_90._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_90._M_head_impl + 8))();
  }
  return psVar1;
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n"
               << indent << "\"" << property.key() << "\": " << "\""
               << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}